

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

void __thiscall
rpc_tests::rpc_convert_values_generatetoaddress::test_method
          (rpc_convert_values_generatetoaddress *this)

{
  long lVar1;
  UniValue *pUVar2;
  string *psVar3;
  long lVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator pvVar6;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  check_type cVar8;
  char *pcVar7;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  allocator_type local_311;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  allocator_type local_18b;
  allocator<char> local_18a;
  allocator<char> local_189;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  allocator<char> local_169;
  undefined1 local_168 [16];
  undefined1 *local_158;
  char *local_150;
  string local_148 [32];
  string local_128 [32];
  undefined1 local_108 [32];
  string local_e8 [56];
  string local_b0;
  UniValue result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  result.val._M_dataplus._M_p = (pointer)&result.val.field_2;
  result.val._M_string_length = 0;
  result.val.field_2._M_local_buf[0] = '\0';
  result.typ = VNULL;
  result.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"generatetoaddress",&local_169);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"101",&local_189);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e8,"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a",&local_18a);
  __l._M_len = 2;
  __l._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_188,__l,&local_18b);
  RPCConvertValues((UniValue *)local_168,&local_b0,&local_188);
  UniValue::operator=(&result,(UniValue *)local_168);
  UniValue::~UniValue((UniValue *)local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::~string((string *)&local_b0);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x198;
  file.m_begin = (iterator)&local_1a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b0,msg);
  local_108[0] = (readonly_property<bool>)0x1;
  local_108._8_8_ = (element_type *)0x0;
  local_108._16_8_ = 0;
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_0113da90;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "no exceptions thrown by result = RPCConvertValues(\"generatetoaddress\", {\"101\", \"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a\"})"
  ;
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1b8 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)local_168,1,1,WARN,_cVar8,
             (size_t)&local_1c0,0x198);
  boost::detail::shared_count::~shared_count((shared_count *)(local_108 + 0x10));
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0x199;
  file_00.m_begin = (iterator)&local_200;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_210,
             msg_00);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_01139f30;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_218 = "";
  pUVar2 = UniValue::operator[](&result,0);
  local_108._0_4_ = UniValue::getInt<int>(pUVar2);
  pvVar5 = local_108;
  local_b0._M_dataplus._M_p._0_4_ = 0x65;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_168,&local_220,0x199,1,2,pvVar5,"result[0].getInt<int>()",&local_b0,"101");
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar6;
  file_01.m_end = (iterator)0x19a;
  file_01.m_begin = (iterator)&local_230;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_240,
             msg_01);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_01139f30;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_248 = "";
  pUVar2 = UniValue::operator[](&result,1);
  psVar3 = UniValue::get_str_abi_cxx11_(pUVar2);
  pcVar7 = "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a";
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[35]>
            (local_168,&local_250,0x19a,1,2,psVar3,"result[1].get_str()",
             "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a","\"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a\"");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"generatetoaddress",&local_169);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"101",&local_189);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e8,"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU",&local_18a);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_188,__l_00,&local_18b);
  RPCConvertValues((UniValue *)local_168,&local_b0,&local_188);
  UniValue::operator=(&result,(UniValue *)local_168);
  UniValue::~UniValue((UniValue *)local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::~string((string *)&local_b0);
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)psVar3;
  msg_02.m_begin = pvVar5;
  file_02.m_end = (iterator)0x19c;
  file_02.m_begin = (iterator)&local_260;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_270,
             msg_02);
  local_108[0] = (readonly_property<bool>)0x1;
  local_108._8_8_ = (element_type *)0x0;
  local_108._16_8_ = 0;
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_0113da90;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "no exceptions thrown by result = RPCConvertValues(\"generatetoaddress\", {\"101\", \"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU\"})"
  ;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_278 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)local_168,1,1,WARN,(check_type)pcVar7,
             (size_t)&local_280,0x19c);
  boost::detail::shared_count::~shared_count((shared_count *)(local_108 + 0x10));
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  file_03.m_end = (iterator)0x19d;
  file_03.m_begin = (iterator)&local_2c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d0,
             msg_03);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_01139f30;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2d8 = "";
  pUVar2 = UniValue::operator[](&result,0);
  local_108._0_4_ = UniValue::getInt<int>(pUVar2);
  pvVar5 = local_108;
  local_b0._M_dataplus._M_p._0_4_ = 0x65;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_168,&local_2e0,0x19d,1,2,pvVar5,"result[0].getInt<int>()",&local_b0,"101");
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar6;
  file_04.m_end = (iterator)0x19e;
  file_04.m_begin = (iterator)&local_2f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_300,
             msg_04);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_01139f30;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_308 = "";
  pUVar2 = UniValue::operator[](&result,1);
  psVar3 = UniValue::get_str_abi_cxx11_(pUVar2);
  pcVar7 = "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU";
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[35]>
            (local_168,&local_310,0x19e,1,2,psVar3,"result[1].get_str()",
             "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU","\"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU\"");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"generatetoaddress",&local_169);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_168,"1",&local_189);
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a",&local_18a);
  std::__cxx11::string::string<std::allocator<char>>(local_128,"9",(allocator<char> *)&local_18b);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_168;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_188,__l_01,&local_311);
  RPCConvertValues((UniValue *)local_108,&local_b0,&local_188);
  UniValue::operator=(&result,(UniValue *)local_108);
  UniValue::~UniValue((UniValue *)local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  lVar4 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_168 + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::~string((string *)&local_b0);
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)psVar3;
  msg_05.m_begin = pvVar5;
  file_05.m_end = (iterator)0x1a0;
  file_05.m_begin = (iterator)&local_328;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_338,
             msg_05);
  local_108[0] = (readonly_property<bool>)0x1;
  local_108._8_8_ = (element_type *)0x0;
  local_108._16_8_ = 0;
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_0113db10;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "no exceptions thrown by result = RPCConvertValues(\"generatetoaddress\", {\"1\", \"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a\", \"9\"})"
  ;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_340 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)local_168,1,1,WARN,(check_type)pcVar7,
             (size_t)&local_348,0x1a0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_108 + 0x10));
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  file_06.m_end = (iterator)0x1a1;
  file_06.m_begin = (iterator)&local_388;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_398,
             msg_06);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_01139f30;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3a0 = "";
  pUVar2 = UniValue::operator[](&result,0);
  local_108._0_4_ = UniValue::getInt<int>(pUVar2);
  pvVar5 = local_108;
  local_b0._M_dataplus._M_p._0_4_ = 1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_168,&local_3a8,0x1a1,1,2,pvVar5,"result[0].getInt<int>()",&local_b0,"1");
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar6;
  file_07.m_end = (iterator)0x1a2;
  file_07.m_begin = (iterator)&local_3b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3c8,
             msg_07);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_01139f30;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3d0 = "";
  pUVar2 = UniValue::operator[](&result,1);
  psVar3 = UniValue::get_str_abi_cxx11_(pUVar2);
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[35]>
            (local_168,&local_3d8,0x1a2,1,2,psVar3,"result[1].get_str()",
             "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a","\"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a\"");
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)psVar3;
  msg_08.m_begin = pvVar5;
  file_08.m_end = (iterator)0x1a3;
  file_08.m_begin = (iterator)&local_3e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3f8,
             msg_08);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_01139f30;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_400 = "";
  pUVar2 = UniValue::operator[](&result,2);
  local_108._0_4_ = UniValue::getInt<int>(pUVar2);
  pvVar5 = local_108;
  local_b0._M_dataplus._M_p._0_4_ = 9;
  psVar3 = &local_b0;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_168,&local_408,0x1a3,1,2,pvVar5,"result[2].getInt<int>()",psVar3,"9");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"generatetoaddress",&local_169);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_168,"1",&local_189);
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU",&local_18a);
  std::__cxx11::string::string<std::allocator<char>>(local_128,"9",(allocator<char> *)&local_18b);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)local_168;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_188,__l_02,&local_311);
  RPCConvertValues((UniValue *)local_108,&local_b0,&local_188);
  UniValue::operator=(&result,(UniValue *)local_108);
  UniValue::~UniValue((UniValue *)local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  lVar4 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_168 + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::~string((string *)&local_b0);
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar5;
  msg_09.m_begin = pvVar6;
  file_09.m_end = (iterator)0x1a5;
  file_09.m_begin = (iterator)&local_418;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_428,
             msg_09);
  local_108[0] = (readonly_property<bool>)0x1;
  local_108._8_8_ = (element_type *)0x0;
  local_108._16_8_ = 0;
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_0113db10;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "no exceptions thrown by result = RPCConvertValues(\"generatetoaddress\", {\"1\", \"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU\", \"9\"})"
  ;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_430 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)local_168,1,1,WARN,(check_type)psVar3,
             (size_t)&local_438,0x1a5);
  boost::detail::shared_count::~shared_count((shared_count *)(local_108 + 0x10));
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  file_10.m_end = (iterator)0x1a6;
  file_10.m_begin = (iterator)&local_478;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_488,
             msg_10);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_01139f30;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_490 = "";
  pUVar2 = UniValue::operator[](&result,0);
  local_108._0_4_ = UniValue::getInt<int>(pUVar2);
  pvVar5 = local_108;
  local_b0._M_dataplus._M_p._0_4_ = 1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_168,&local_498,0x1a6,1,2,pvVar5,"result[0].getInt<int>()",&local_b0,"1");
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar5;
  msg_11.m_begin = pvVar6;
  file_11.m_end = (iterator)0x1a7;
  file_11.m_begin = (iterator)&local_4a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_4b8,
             msg_11);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_01139f30;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4c0 = "";
  pUVar2 = UniValue::operator[](&result,1);
  psVar3 = UniValue::get_str_abi_cxx11_(pUVar2);
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[35]>
            (local_168,&local_4c8,0x1a7,1,2,psVar3,"result[1].get_str()",
             "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU","\"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU\"");
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = (iterator)psVar3;
  msg_12.m_begin = pvVar5;
  file_12.m_end = (iterator)0x1a8;
  file_12.m_begin = (iterator)&local_4d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_4e8,
             msg_12);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_01139f30;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_4f0 = "";
  pUVar2 = UniValue::operator[](&result,2);
  local_108._0_4_ = UniValue::getInt<int>(pUVar2);
  local_b0._M_dataplus._M_p._0_4_ = 9;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_168,&local_4f8,0x1a8,1,2,local_108,"result[2].getInt<int>()",&local_b0,"9");
  UniValue::~UniValue(&result);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_convert_values_generatetoaddress)
{
    UniValue result;

    BOOST_CHECK_NO_THROW(result = RPCConvertValues("generatetoaddress", {"101", "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a"}));
    BOOST_CHECK_EQUAL(result[0].getInt<int>(), 101);
    BOOST_CHECK_EQUAL(result[1].get_str(), "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a");

    BOOST_CHECK_NO_THROW(result = RPCConvertValues("generatetoaddress", {"101", "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU"}));
    BOOST_CHECK_EQUAL(result[0].getInt<int>(), 101);
    BOOST_CHECK_EQUAL(result[1].get_str(), "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU");

    BOOST_CHECK_NO_THROW(result = RPCConvertValues("generatetoaddress", {"1", "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a", "9"}));
    BOOST_CHECK_EQUAL(result[0].getInt<int>(), 1);
    BOOST_CHECK_EQUAL(result[1].get_str(), "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a");
    BOOST_CHECK_EQUAL(result[2].getInt<int>(), 9);

    BOOST_CHECK_NO_THROW(result = RPCConvertValues("generatetoaddress", {"1", "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU", "9"}));
    BOOST_CHECK_EQUAL(result[0].getInt<int>(), 1);
    BOOST_CHECK_EQUAL(result[1].get_str(), "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU");
    BOOST_CHECK_EQUAL(result[2].getInt<int>(), 9);
}